

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS ref_grid_drop_volume(REF_GRID ref_grid)

{
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_ADJ pRVar1;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  long lVar5;
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  uVar2 = ref_cell_free(ref_grid->cell[0xb]);
  if (uVar2 == 0) {
    uVar2 = ref_cell_free(ref_grid->cell[10]);
    if (uVar2 == 0) {
      uVar2 = ref_cell_free(ref_grid->cell[9]);
      if (uVar2 == 0) {
        uVar2 = ref_cell_free(ref_grid->cell[8]);
        if (uVar2 == 0) {
          uVar2 = ref_cell_create(ref_grid->cell + 8,REF_CELL_TET);
          if (uVar2 == 0) {
            uVar2 = ref_cell_create(ref_grid->cell + 9,REF_CELL_PYR);
            if (uVar2 == 0) {
              uVar2 = ref_cell_create(ref_grid->cell + 10,REF_CELL_PRI);
              if (uVar2 == 0) {
                uVar2 = ref_cell_create(ref_grid->cell + 0xb,REF_CELL_HEX);
                if (uVar2 == 0) {
                  ref_mpi_stopwatch_stop(ref_mpi,"dump vol cells");
                  for (lVar5 = 0; lVar5 < ref_node->max; lVar5 = lVar5 + 1) {
                    if ((((-1 < ref_node->global[lVar5]) &&
                         ((pRVar1 = ref_grid->cell[6]->ref_adj, pRVar1->nnode <= lVar5 ||
                          (pRVar1->first[lVar5] == -1)))) &&
                        ((pRVar1 = ref_grid->cell[3]->ref_adj, pRVar1->nnode <= lVar5 ||
                         (pRVar1->first[lVar5] == -1)))) &&
                       (((pRVar1 = ref_grid->cell[0]->ref_adj, pRVar1->nnode <= lVar5 ||
                         (pRVar1->first[lVar5] == -1)) &&
                        (uVar2 = ref_node_remove_invalidates_sorted(ref_node,(REF_INT)lVar5),
                        uVar2 != 0)))) {
                      pcVar4 = "rm node";
                      uVar3 = 0x4c5;
                      goto LAB_0015a089;
                    }
                  }
                  ref_mpi_stopwatch_stop(ref_mpi,"del nodes");
                  uVar2 = ref_node_rebuild_sorted_global(ref_node);
                  if (uVar2 == 0) {
                    ref_mpi_stopwatch_stop(ref_mpi,"rebuild nodes");
                    uVar2 = ref_node_synchronize_globals(ref_node);
                    if (uVar2 == 0) {
                      ref_mpi_stopwatch_stop(ref_mpi,"sync nodes");
                      return 0;
                    }
                    pcVar4 = "sync, lazy delete globals";
                    uVar3 = 0x4cb;
                  }
                  else {
                    pcVar4 = "rebuild";
                    uVar3 = 0x4c9;
                  }
                }
                else {
                  pcVar4 = "hex create";
                  uVar3 = 0x4bf;
                }
              }
              else {
                pcVar4 = "pri create";
                uVar3 = 0x4be;
              }
            }
            else {
              pcVar4 = "pyr create";
              uVar3 = 0x4bd;
            }
          }
          else {
            pcVar4 = "tet create";
            uVar3 = 0x4bc;
          }
        }
        else {
          pcVar4 = "tet free";
          uVar3 = 0x4bb;
        }
      }
      else {
        pcVar4 = "pyr free";
        uVar3 = 0x4ba;
      }
    }
    else {
      pcVar4 = "pri free";
      uVar3 = 0x4b9;
    }
  }
  else {
    pcVar4 = "hex free";
    uVar3 = 0x4b8;
  }
LAB_0015a089:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar3,
         "ref_grid_drop_volume",(ulong)uVar2,pcVar4);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_grid_drop_volume(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  RSS(ref_cell_free(ref_grid_hex(ref_grid)), "hex free");
  RSS(ref_cell_free(ref_grid_pri(ref_grid)), "pri free");
  RSS(ref_cell_free(ref_grid_pyr(ref_grid)), "pyr free");
  RSS(ref_cell_free(ref_grid_tet(ref_grid)), "tet free");
  RSS(ref_cell_create(&ref_grid_tet(ref_grid), REF_CELL_TET), "tet create");
  RSS(ref_cell_create(&ref_grid_pyr(ref_grid), REF_CELL_PYR), "pyr create");
  RSS(ref_cell_create(&ref_grid_pri(ref_grid), REF_CELL_PRI), "pri create");
  RSS(ref_cell_create(&ref_grid_hex(ref_grid), REF_CELL_HEX), "hex create");
  ref_mpi_stopwatch_stop(ref_mpi, "dump vol cells");
  each_ref_node_valid_node(ref_node, node) {
    if (ref_cell_node_empty(ref_grid_qua(ref_grid), node) &&
        ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
        ref_cell_node_empty(ref_grid_edg(ref_grid), node)) {
      RSS(ref_node_remove_invalidates_sorted(ref_node, node), "rm node");
    }
  }
  ref_mpi_stopwatch_stop(ref_mpi, "del nodes");
  RSS(ref_node_rebuild_sorted_global(ref_node), "rebuild");
  ref_mpi_stopwatch_stop(ref_mpi, "rebuild nodes");
  RSS(ref_node_synchronize_globals(ref_node), "sync, lazy delete globals");
  ref_mpi_stopwatch_stop(ref_mpi, "sync nodes");
  return REF_SUCCESS;
}